

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pubkey.h
# Opt level: O2

void __thiscall CPubKey::Set<unsigned_char*>(CPubKey *this,uchar *pbegin,uchar *pend)

{
  byte bVar1;
  long lVar2;
  long in_FS_OFFSET;
  size_t sStack_10;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  if (pend != pbegin) {
    bVar1 = *pbegin;
    if ((bVar1 & 0xfe) == 2) {
      sStack_10 = 0x21;
    }
    else {
      if ((7 < bVar1) || ((0xd0U >> (bVar1 & 0x1f) & 1) == 0)) goto LAB_00438beb;
      sStack_10 = 0x41;
    }
    if ((long)pend - (long)pbegin == sStack_10) {
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
        memcpy(this,pbegin,sStack_10);
        return;
      }
      goto LAB_00438bff;
    }
  }
LAB_00438beb:
  this->vch[0] = 0xff;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return;
  }
LAB_00438bff:
  __stack_chk_fail();
}

Assistant:

void Set(const T pbegin, const T pend)
    {
        int len = pend == pbegin ? 0 : GetLen(pbegin[0]);
        if (len && len == (pend - pbegin))
            memcpy(vch, (unsigned char*)&pbegin[0], len);
        else
            Invalidate();
    }